

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
::parse_flags(basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>
              *this,format_specs *spec,iterator *it)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  byte bVar4;
  char *pcVar5;
  
  pcVar3 = it->end_;
  bVar4 = (spec->super_core_format_specs).flags;
  pcVar5 = it->ptr_;
  while( true ) {
    pcVar1 = pcVar5 + 1;
    it->ptr_ = pcVar1;
    if (pcVar5 == pcVar3) break;
    cVar2 = *pcVar5;
    if (cVar2 == '-') {
      (spec->super_align_spec).align_ = ALIGN_LEFT;
      pcVar5 = pcVar1;
    }
    else if (cVar2 == '0') {
      (spec->super_align_spec).fill_ = L'0';
      pcVar5 = pcVar1;
    }
    else {
      if (cVar2 == ' ') {
        bVar4 = bVar4 | 1;
      }
      else if (cVar2 == '#') {
        bVar4 = bVar4 | 8;
      }
      else {
        if (cVar2 != '+') break;
        bVar4 = bVar4 | 3;
      }
      (spec->super_core_format_specs).flags = bVar4;
      pcVar5 = pcVar5 + 1;
    }
  }
  it->ptr_ = pcVar5;
  return;
}

Assistant:

void basic_printf_context<OutputIt, Char, AF>::parse_flags(
    format_specs &spec, iterator &it) {
  for (;;) {
    switch (*it++) {
      case '-':
        spec.align_ = ALIGN_LEFT;
        break;
      case '+':
        spec.flags |= SIGN_FLAG | PLUS_FLAG;
        break;
      case '0':
        spec.fill_ = '0';
        break;
      case ' ':
        spec.flags |= SIGN_FLAG;
        break;
      case '#':
        spec.flags |= HASH_FLAG;
        break;
      default:
        --it;
        return;
    }
  }
}